

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.h
# Opt level: O0

void DrawerCommandQueue::QueueCommand<swrenderer::DrawWallMasked1PalCommand>(void)

{
  DrawWallMasked1PalCommand *this;
  bool bVar1;
  DrawerCommandQueue *this_00;
  _func_void_void_ptr *tryBlock;
  _func_void_void_ptr_char_ptr_bool *catchBlock;
  value_type local_98;
  DrawWallMasked1PalCommand *local_90;
  DrawWallMasked1PalCommand *command_1;
  void *ptr;
  _lambda_void__char_const__bool__1_ local_6a;
  _lambda_void___1_ local_69;
  undefined1 auStack_68 [8];
  DrawWallMasked1PalCommand command;
  DrawerCommandQueue *queue;
  
  this_00 = Instance();
  if ((this_00->threaded_render == 0) ||
     (bVar1 = FBoolCVar::operator_cast_to_bool(&r_multithreaded), !bVar1)) {
    command.super_PalWall1Command._fracbits = 0;
    command.super_PalWall1Command._pitch = 0;
    command.super_PalWall1Command._srcblend = (uint32_t *)0x0;
    command.super_PalWall1Command._source = (uint8_t *)0x0;
    command.super_PalWall1Command._dest = (uint8_t *)0x0;
    command.super_PalWall1Command._colormap = (uint8_t *)0x0;
    command.super_PalWall1Command._count = 0;
    command.super_PalWall1Command._36_4_ = 0;
    command.super_PalWall1Command.super_DrawerCommand._dest_y = 0;
    command.super_PalWall1Command.super_DrawerCommand._12_4_ = 0;
    command.super_PalWall1Command._texturefrac = 0;
    command.super_PalWall1Command._20_4_ = 0;
    auStack_68 = (undefined1  [8])0x0;
    command.super_PalWall1Command.super_DrawerCommand._vptr_DrawerCommand = (_func_int **)0x0;
    swrenderer::DrawWallMasked1PalCommand::DrawWallMasked1PalCommand
              ((DrawWallMasked1PalCommand *)auStack_68);
    tryBlock = QueueCommand()::{lambda(void*)#1}::operator_cast_to_function_pointer(&local_69);
    catchBlock = QueueCommand()::{lambda(void*,char_const*,bool)#1}::
                 operator_cast_to_function_pointer(&local_6a);
    VectoredTryCatch((DrawWallMasked1PalCommand *)auStack_68,tryBlock,catchBlock);
    swrenderer::DrawWallMasked1PalCommand::~DrawWallMasked1PalCommand
              ((DrawWallMasked1PalCommand *)auStack_68);
  }
  else {
    command_1 = (DrawWallMasked1PalCommand *)AllocMemory(0x50);
    if (command_1 == (DrawWallMasked1PalCommand *)0x0) {
      Finish(this_00);
      command_1 = (DrawWallMasked1PalCommand *)AllocMemory(0x50);
      if (command_1 == (DrawWallMasked1PalCommand *)0x0) {
        return;
      }
    }
    this = command_1;
    memset(command_1,0,0x50);
    swrenderer::DrawWallMasked1PalCommand::DrawWallMasked1PalCommand(this);
    local_90 = this;
    local_98 = (value_type)this;
    std::vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>::push_back
              (&this_00->commands,&local_98);
  }
  return;
}

Assistant:

static void QueueCommand(Types &&... args)
	{
		auto queue = Instance();
		if (queue->threaded_render == 0 || !r_multithreaded)
		{
			T command(std::forward<Types>(args)...);
			VectoredTryCatch(&command,
			[](void *data)
			{
				T *c = (T*)data;
				c->Execute(&Instance()->single_core_thread);
			},
			[](void *data, const char *reason, bool fatal)
			{
				T *c = (T*)data;
				ReportDrawerError(c, false, reason, fatal);
			});
		}
		else
		{
			void *ptr = AllocMemory(sizeof(T));
			if (!ptr) // Out of memory - render what we got
			{
				queue->Finish();
				ptr = AllocMemory(sizeof(T));
				if (!ptr)
					return;
			}
			T *command = new (ptr)T(std::forward<Types>(args)...);
			queue->commands.push_back(command);
		}
	}